

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O2

int __thiscall cppcms::http::context::on_headers_ready(context *this)

{
  _data *p_Var1;
  application *paVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  intrusive_ptr<cppcms::application> iVar5;
  element_type *srv;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  service *this_00;
  applications_pool *host;
  unsigned_long_long uVar10;
  intrusive_ptr<cppcms::application> app;
  context_guard g;
  string matched;
  intrusive_ptr<cppcms::application> local_88;
  application_specific_pool local_80;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50 [16];
  string local_40 [32];
  
  iVar6 = (*((this->conn_).
             super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_connection[0x17])();
  iVar7 = (*((this->conn_).
             super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_connection[0x16])();
  iVar8 = (*((this->conn_).
             super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_connection[0x15])();
  local_60 = local_50;
  local_58 = 0;
  local_50[0] = 0;
  local_88.p_ = (application *)0x0;
  this_00 = service(this);
  host = cppcms::service::applications_pool(this_00);
  applications_pool::get_application_specific_pool
            ((applications_pool *)
             &local_80.super_enable_shared_from_this<cppcms::application_specific_pool>,(char *)host
             ,(char *)CONCAT44(extraout_var,iVar6),(char *)CONCAT44(extraout_var_01,iVar8),
             (string *)CONCAT44(extraout_var_00,iVar7));
  if (local_80.super_enable_shared_from_this<cppcms::application_specific_pool>._M_weak_this.
      super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    iVar6 = 0x194;
  }
  else {
    http::request::prepare(&((this->d).ptr_)->request);
    uVar10 = http::request::content_length(&((this->d).ptr_)->request);
    if (uVar10 != 0) {
      uVar9 = application_specific_pool::flags
                        (local_80.super_enable_shared_from_this<cppcms::application_specific_pool>.
                         _M_weak_this.
                         super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      srv = local_80.super_enable_shared_from_this<cppcms::application_specific_pool>._M_weak_this.
            super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((uVar9 & 0x40) != 0 && (uVar9 & 0xf) != 0) {
        service(this);
        application_specific_pool::get(&local_80,(service *)srv);
        booster::intrusive_ptr<cppcms::application>::operator=
                  (&local_88,(intrusive_ptr<cppcms::application> *)&local_80);
        booster::intrusive_ptr<cppcms::application>::~intrusive_ptr
                  ((intrusive_ptr<cppcms::application> *)&local_80);
        if (local_88.p_ == (application *)0x0) {
          iVar6 = 500;
          goto LAB_0020769d;
        }
        anon_unknown_3::context_guard::context_guard((context_guard *)&local_80,local_88.p_,this);
        iVar5.p_ = local_88.p_;
        std::__cxx11::string::string(local_40,(string *)&local_60);
        (*(iVar5.p_)->_vptr_application[2])(iVar5.p_,local_40);
        std::__cxx11::string::~string(local_40);
        anon_unknown_3::context_guard::~context_guard((context_guard *)&local_80);
      }
    }
    p_Var1 = (this->d).ptr_;
    peVar3 = (p_Var1->pool).
             super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var4 = (p_Var1->pool).
             super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (p_Var1->pool).super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_80.super_enable_shared_from_this<cppcms::application_specific_pool>._M_weak_this
              .super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    (p_Var1->pool).super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_80.super_enable_shared_from_this<cppcms::application_specific_pool>._M_weak_this.
         super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ._M_pi;
    local_80.super_enable_shared_from_this<cppcms::application_specific_pool>._M_weak_this.
    super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
    local_80.super_enable_shared_from_this<cppcms::application_specific_pool>._M_weak_this.
    super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var4;
    std::__cxx11::string::swap((string *)&((this->d).ptr_)->matched);
    p_Var1 = (this->d).ptr_;
    paVar2 = (p_Var1->app).p_;
    (p_Var1->app).p_ = local_88.p_;
    local_88.p_ = paVar2;
    iVar6 = http::request::on_content_start(&p_Var1->request);
  }
LAB_0020769d:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_80.super_enable_shared_from_this<cppcms::application_specific_pool>._M_weak_this
              .super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&local_88);
  std::__cxx11::string::~string((string *)&local_60);
  return iVar6;
}

Assistant:

int context::on_headers_ready()
{
	char const *host = conn_->env_http_host();
	char const *path_info = conn_->env_path_info();
	char const *script_name = conn_->env_script_name();
	std::string matched;

	booster::intrusive_ptr<application> app;
	booster::shared_ptr<application_specific_pool> pool = 
		service().applications_pool().get_application_specific_pool(
			host,
			script_name,
			path_info,
			matched
			);
	if(!pool)
		return 404;
	
	request().prepare();

	int flags;
	
	if(request().content_length() != 0 && ((flags=pool->flags()) & app::op_mode_mask) != app::synchronous && (flags & app::content_filter)!=0) {
		app = pool->get(service());
		if(!app)
			return 500;
		try {
			context_guard g(app.get(),*this);
			app->main(matched);
		}
		catch(...) {
			return translate_exception();
		}
	}

	d->pool.swap(pool);
	d->matched.swap(matched);
	d->app.swap(app);
	
	return request().on_content_start();
}